

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t pax_attribute(archive_read *a,tar *tar,archive_entry *entry,char *key,char *value,
                     size_t value_length)

{
  wchar_t wVar1;
  int iVar2;
  size_t sVar3;
  dev_t dVar4;
  unsigned_long uVar5;
  aest *paVar6;
  char *pcVar7;
  size_t sVar8;
  int64_t iVar9;
  size_t local_188;
  size_t local_158;
  size_t local_140;
  size_t local_128;
  size_t local_a0;
  wchar_t local_54;
  wchar_t r;
  wchar_t err;
  long n;
  int64_t s;
  size_t value_length_local;
  char *value_local;
  char *key_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  local_54 = L'\0';
  value_length_local = (size_t)value;
  if (value == (char *)0x0) {
    value_length_local = (long)"PK\x01\x02" + 4;
  }
  s = value_length;
  value_local = key;
  key_local = (char *)entry;
  entry_local = (archive_entry *)tar;
  tar_local = (tar *)a;
  switch(*key) {
  case 'G':
    iVar2 = strncmp(key,"GNU.sparse",10);
    if ((iVar2 == 0) && ((int)entry_local->ae_fflags_clear == 0)) {
      archive_set_error((archive *)tar_local,-1,"Non-regular file cannot be sparse");
      return L'\xffffffe2';
    }
    iVar2 = strcmp(value_local,"GNU.sparse.numblocks");
    if (iVar2 == 0) {
      (entry_local->ae_gname).aes_mbs.buffer_length = 0xffffffffffffffff;
      (entry_local->ae_gname).aes_utf8.s = (char *)0xffffffffffffffff;
      *(undefined4 *)&(entry_local->ae_gname).aes_utf8.length = 0;
      *(undefined4 *)((long)&(entry_local->ae_gname).aes_utf8.length + 4) = 0;
    }
    iVar2 = strcmp(value_local,"GNU.sparse.offset");
    sVar3 = value_length_local;
    if (iVar2 == 0) {
      sVar8 = strlen((char *)value_length_local);
      sVar3 = tar_atol10((char *)sVar3,sVar8);
      (entry_local->ae_gname).aes_mbs.buffer_length = sVar3;
      if ((entry_local->ae_gname).aes_utf8.s != (char *)0xffffffffffffffff) {
        wVar1 = gnu_add_sparse_entry
                          ((archive_read *)tar_local,(tar *)entry_local,
                           (entry_local->ae_gname).aes_mbs.buffer_length,
                           (int64_t)(entry_local->ae_gname).aes_utf8.s);
        if (wVar1 != L'\0') {
          return L'\xffffffe2';
        }
        (entry_local->ae_gname).aes_mbs.buffer_length = 0xffffffffffffffff;
        (entry_local->ae_gname).aes_utf8.s = (char *)0xffffffffffffffff;
      }
    }
    iVar2 = strcmp(value_local,"GNU.sparse.numbytes");
    sVar3 = value_length_local;
    if (iVar2 == 0) {
      sVar8 = strlen((char *)value_length_local);
      pcVar7 = (char *)tar_atol10((char *)sVar3,sVar8);
      (entry_local->ae_gname).aes_utf8.s = pcVar7;
      if ((entry_local->ae_gname).aes_mbs.buffer_length != 0xffffffffffffffff) {
        wVar1 = gnu_add_sparse_entry
                          ((archive_read *)tar_local,(tar *)entry_local,
                           (entry_local->ae_gname).aes_mbs.buffer_length,
                           (int64_t)(entry_local->ae_gname).aes_utf8.s);
        if (wVar1 != L'\0') {
          return L'\xffffffe2';
        }
        (entry_local->ae_gname).aes_mbs.buffer_length = 0xffffffffffffffff;
        (entry_local->ae_gname).aes_utf8.s = (char *)0xffffffffffffffff;
      }
    }
    iVar2 = strcmp(value_local,"GNU.sparse.size");
    sVar3 = value_length_local;
    if (iVar2 == 0) {
      sVar8 = strlen((char *)value_length_local);
      uVar5 = tar_atol10((char *)sVar3,sVar8);
      entry_local->ae_fflags_set = uVar5;
      archive_entry_set_size((archive_entry *)key_local,entry_local->ae_fflags_set);
      *(undefined4 *)&(entry_local->ae_hardlink).aes_mbs.buffer_length = 1;
    }
    iVar2 = strcmp(value_local,"GNU.sparse.map");
    if (iVar2 == 0) {
      *(undefined4 *)&(entry_local->ae_gname).aes_utf8.length = 0;
      *(undefined4 *)((long)&(entry_local->ae_gname).aes_utf8.length + 4) = 1;
      wVar1 = gnu_sparse_01_parse((archive_read *)tar_local,(tar *)entry_local,
                                  (char *)value_length_local);
      if (wVar1 != L'\0') {
        return L'\xffffffec';
      }
    }
    iVar2 = strcmp(value_local,"GNU.sparse.major");
    sVar3 = value_length_local;
    if (iVar2 == 0) {
      sVar8 = strlen((char *)value_length_local);
      iVar9 = tar_atol10((char *)sVar3,sVar8);
      *(int *)&(entry_local->ae_gname).aes_utf8.length = (int)iVar9;
      *(undefined1 *)&(entry_local->ae_gname).aes_utf8.buffer_length = 1;
    }
    iVar2 = strcmp(value_local,"GNU.sparse.minor");
    sVar3 = value_length_local;
    if (iVar2 == 0) {
      sVar8 = strlen((char *)value_length_local);
      iVar9 = tar_atol10((char *)sVar3,sVar8);
      *(int *)((long)&(entry_local->ae_gname).aes_utf8.length + 4) = (int)iVar9;
      *(undefined1 *)&(entry_local->ae_gname).aes_utf8.buffer_length = 1;
    }
    iVar2 = strcmp(value_local,"GNU.sparse.name");
    sVar3 = value_length_local;
    if (iVar2 == 0) {
      (entry_local->ae_stat).aest_mtime = 0;
      paVar6 = &entry_local->ae_stat;
      if (value_length_local == 0) {
        local_a0 = 0;
      }
      else {
        local_a0 = strlen((char *)value_length_local);
      }
      archive_strncat((archive_string *)&paVar6->aest_ctime_nsec,(void *)sVar3,local_a0);
    }
    iVar2 = strcmp(value_local,"GNU.sparse.realsize");
    sVar3 = value_length_local;
    if (iVar2 == 0) {
      sVar8 = strlen((char *)value_length_local);
      uVar5 = tar_atol10((char *)sVar3,sVar8);
      entry_local->ae_fflags_set = uVar5;
      archive_entry_set_size((archive_entry *)key_local,entry_local->ae_fflags_set);
      *(undefined4 *)&(entry_local->ae_hardlink).aes_mbs.buffer_length = 1;
    }
    break;
  case 'L':
    iVar2 = strcmp(key,"LIBARCHIVE.creationtime");
    if (iVar2 == 0) {
      pax_time((char *)value_length_local,&n,(long *)&r);
      archive_entry_set_birthtime((archive_entry *)key_local,n,_r);
    }
    iVar2 = strcmp(value_local,"LIBARCHIVE.symlinktype");
    if (iVar2 == 0) {
      iVar2 = strcmp((char *)value_length_local,"file");
      if (iVar2 == 0) {
        archive_entry_set_symlink_type((archive_entry *)key_local,L'\x01');
      }
      else {
        iVar2 = strcmp((char *)value_length_local,"dir");
        if (iVar2 == 0) {
          archive_entry_set_symlink_type((archive_entry *)key_local,L'\x02');
        }
      }
    }
    iVar2 = memcmp(value_local,"LIBARCHIVE.xattr.",0x11);
    if (iVar2 == 0) {
      pax_attribute_xattr((archive_entry *)key_local,value_local,(char *)value_length_local);
    }
    break;
  case 'R':
    iVar2 = strcmp(key,"RHT.security.selinux");
    if (iVar2 == 0) {
      pax_attribute_rht_security_selinux((archive_entry *)key_local,(char *)value_length_local,s);
    }
    break;
  case 'S':
    iVar2 = strcmp(key,"SCHILY.acl.access");
    if (iVar2 == 0) {
      wVar1 = pax_attribute_acl((archive_read *)tar_local,(tar *)entry_local,
                                (archive_entry *)key_local,(char *)value_length_local,L'Ā');
      if (wVar1 == L'\xffffffe2') {
        return L'\xffffffe2';
      }
    }
    else {
      iVar2 = strcmp(value_local,"SCHILY.acl.default");
      if (iVar2 == 0) {
        wVar1 = pax_attribute_acl((archive_read *)tar_local,(tar *)entry_local,
                                  (archive_entry *)key_local,(char *)value_length_local,L'Ȁ');
        if (wVar1 == L'\xffffffe2') {
          return L'\xffffffe2';
        }
      }
      else {
        iVar2 = strcmp(value_local,"SCHILY.acl.ace");
        if (iVar2 == 0) {
          wVar1 = pax_attribute_acl((archive_read *)tar_local,(tar *)entry_local,
                                    (archive_entry *)key_local,(char *)value_length_local,L'㰀');
          if (wVar1 == L'\xffffffe2') {
            return L'\xffffffe2';
          }
        }
        else {
          iVar2 = strcmp(value_local,"SCHILY.devmajor");
          pcVar7 = key_local;
          sVar3 = value_length_local;
          if (iVar2 == 0) {
            sVar8 = strlen((char *)value_length_local);
            dVar4 = tar_atol10((char *)sVar3,sVar8);
            archive_entry_set_rdevmajor((archive_entry *)pcVar7,dVar4);
          }
          else {
            iVar2 = strcmp(value_local,"SCHILY.devminor");
            pcVar7 = key_local;
            sVar3 = value_length_local;
            if (iVar2 == 0) {
              sVar8 = strlen((char *)value_length_local);
              dVar4 = tar_atol10((char *)sVar3,sVar8);
              archive_entry_set_rdevminor((archive_entry *)pcVar7,dVar4);
            }
            else {
              iVar2 = strcmp(value_local,"SCHILY.fflags");
              if (iVar2 == 0) {
                archive_entry_copy_fflags_text
                          ((archive_entry *)key_local,(char *)value_length_local);
              }
              else {
                iVar2 = strcmp(value_local,"SCHILY.dev");
                pcVar7 = key_local;
                sVar3 = value_length_local;
                if (iVar2 == 0) {
                  sVar8 = strlen((char *)value_length_local);
                  dVar4 = tar_atol10((char *)sVar3,sVar8);
                  archive_entry_set_dev((archive_entry *)pcVar7,dVar4);
                }
                else {
                  iVar2 = strcmp(value_local,"SCHILY.ino");
                  pcVar7 = key_local;
                  sVar3 = value_length_local;
                  if (iVar2 == 0) {
                    sVar8 = strlen((char *)value_length_local);
                    iVar9 = tar_atol10((char *)sVar3,sVar8);
                    archive_entry_set_ino((archive_entry *)pcVar7,iVar9);
                  }
                  else {
                    iVar2 = strcmp(value_local,"SCHILY.nlink");
                    pcVar7 = key_local;
                    sVar3 = value_length_local;
                    if (iVar2 == 0) {
                      sVar8 = strlen((char *)value_length_local);
                      iVar9 = tar_atol10((char *)sVar3,sVar8);
                      archive_entry_set_nlink((archive_entry *)pcVar7,(uint)iVar9);
                    }
                    else {
                      iVar2 = strcmp(value_local,"SCHILY.realsize");
                      sVar3 = value_length_local;
                      if (iVar2 == 0) {
                        sVar8 = strlen((char *)value_length_local);
                        uVar5 = tar_atol10((char *)sVar3,sVar8);
                        entry_local->ae_fflags_set = uVar5;
                        *(undefined4 *)&(entry_local->ae_hardlink).aes_mbs.buffer_length = 1;
                        archive_entry_set_size
                                  ((archive_entry *)key_local,entry_local->ae_fflags_set);
                      }
                      else {
                        iVar2 = strncmp(value_local,"SCHILY.xattr.",0xd);
                        if (iVar2 == 0) {
                          pax_attribute_schily_xattr
                                    ((archive_entry *)key_local,value_local,
                                     (char *)value_length_local,s);
                        }
                        else {
                          iVar2 = strcmp(value_local,"SUN.holesdata");
                          if ((iVar2 == 0) &&
                             (wVar1 = solaris_sparse_parse
                                                ((archive_read *)tar_local,(tar *)entry_local,
                                                 (archive_entry *)key_local,
                                                 (char *)value_length_local), wVar1 < L'\0')) {
                            if (wVar1 == L'\xffffffe2') {
                              return L'\xffffffe2';
                            }
                            archive_set_error((archive *)tar_local,-1,"Parse error: SUN.holesdata");
                            local_54 = wVar1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    break;
  case 'a':
    iVar2 = strcmp(key,"atime");
    if (iVar2 == 0) {
      pax_time((char *)value_length_local,&n,(long *)&r);
      archive_entry_set_atime((archive_entry *)key_local,n,_r);
    }
    break;
  case 'c':
    iVar2 = strcmp(key,"ctime");
    if (iVar2 == 0) {
      pax_time((char *)value_length_local,&n,(long *)&r);
      archive_entry_set_ctime((archive_entry *)key_local,n,_r);
    }
    else {
      iVar2 = strcmp(value_local,"charset");
      if (iVar2 != 0) {
        strcmp(value_local,"comment");
      }
    }
    break;
  case 'g':
    iVar2 = strcmp(key,"gid");
    pcVar7 = key_local;
    sVar3 = value_length_local;
    if (iVar2 == 0) {
      sVar8 = strlen((char *)value_length_local);
      iVar9 = tar_atol10((char *)sVar3,sVar8);
      archive_entry_set_gid((archive_entry *)pcVar7,iVar9);
    }
    else {
      iVar2 = strcmp(value_local,"gname");
      sVar3 = value_length_local;
      if (iVar2 == 0) {
        *(undefined8 *)&(entry_local->ae_stat).aest_dev_is_broken_down = 0;
        paVar6 = &entry_local->ae_stat;
        if (value_length_local == 0) {
          local_128 = 0;
        }
        else {
          local_128 = strlen((char *)value_length_local);
        }
        archive_strncat((archive_string *)&paVar6->aest_uid,(void *)sVar3,local_128);
      }
    }
    break;
  case 'h':
    iVar2 = strcmp(key,"hdrcharset");
    if (iVar2 == 0) {
      iVar2 = strcmp((char *)value_length_local,"BINARY");
      if (iVar2 == 0) {
        *(undefined4 *)&(entry_local->ae_fflags_text).aes_wcs.buffer_length = 1;
      }
      else {
        iVar2 = strcmp((char *)value_length_local,"ISO-IR 10646 2000 UTF-8");
        if (iVar2 == 0) {
          *(undefined4 *)&(entry_local->ae_fflags_text).aes_wcs.buffer_length = 0;
        }
      }
    }
    break;
  case 'l':
    iVar2 = strcmp(key,"linkpath");
    sVar3 = value_length_local;
    if (iVar2 == 0) {
      *(undefined8 *)&(entry_local->ae_stat).aest_birthtime_nsec = 0;
      paVar6 = &entry_local->ae_stat;
      if (value_length_local == 0) {
        local_140 = 0;
      }
      else {
        local_140 = strlen((char *)value_length_local);
      }
      archive_strncat((archive_string *)&paVar6->aest_birthtime,(void *)sVar3,local_140);
    }
    break;
  case 'm':
    iVar2 = strcmp(key,"mtime");
    if (iVar2 == 0) {
      pax_time((char *)value_length_local,&n,(long *)&r);
      archive_entry_set_mtime((archive_entry *)key_local,n,_r);
    }
    break;
  case 'p':
    iVar2 = strcmp(key,"path");
    sVar3 = value_length_local;
    if (iVar2 == 0) {
      *(undefined8 *)&(entry_local->ae_stat).aest_atime_nsec = 0;
      paVar6 = &entry_local->ae_stat;
      if (value_length_local == 0) {
        local_158 = 0;
      }
      else {
        local_158 = strlen((char *)value_length_local);
      }
      archive_strncat((archive_string *)paVar6,(void *)sVar3,local_158);
    }
    break;
  case 'r':
    break;
  case 's':
    iVar2 = strcmp(key,"size");
    sVar3 = value_length_local;
    if (iVar2 == 0) {
      sVar8 = strlen((char *)value_length_local);
      pcVar7 = (char *)tar_atol10((char *)sVar3,sVar8);
      (entry_local->ae_fflags_text).aes_mbs_in_locale.s = pcVar7;
      if ((int)(entry_local->ae_hardlink).aes_mbs.buffer_length == 0) {
        archive_entry_set_size
                  ((archive_entry *)key_local,
                   (la_int64_t)(entry_local->ae_fflags_text).aes_mbs_in_locale.s);
        entry_local->ae_fflags_set =
             (unsigned_long)(entry_local->ae_fflags_text).aes_mbs_in_locale.s;
      }
    }
    break;
  case 'u':
    iVar2 = strcmp(key,"uid");
    pcVar7 = key_local;
    sVar3 = value_length_local;
    if (iVar2 == 0) {
      sVar8 = strlen((char *)value_length_local);
      iVar9 = tar_atol10((char *)sVar3,sVar8);
      archive_entry_set_uid((archive_entry *)pcVar7,iVar9);
    }
    else {
      iVar2 = strcmp(value_local,"uname");
      sVar3 = value_length_local;
      if (iVar2 == 0) {
        *(undefined8 *)&(entry_local->ae_stat).aest_nlink = 0;
        paVar6 = &entry_local->ae_stat;
        if (value_length_local == 0) {
          local_188 = 0;
        }
        else {
          local_188 = strlen((char *)value_length_local);
        }
        archive_strncat((archive_string *)&paVar6->aest_ino,(void *)sVar3,local_188);
      }
    }
  }
  return local_54;
}

Assistant:

static int
pax_attribute(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const char *key, const char *value, size_t value_length)
{
	int64_t s;
	long n;
	int err = ARCHIVE_OK, r;

	if (value == NULL)
		value = "";	/* Disable compiler warning; do not pass
				 * NULL pointer to strlen().  */
	switch (key[0]) {
	case 'G':
		/* Reject GNU.sparse.* headers on non-regular files. */
		if (strncmp(key, "GNU.sparse", 10) == 0 &&
		    !tar->sparse_allowed) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Non-regular file cannot be sparse");
			return (ARCHIVE_FATAL);
		}

		/* GNU "0.0" sparse pax format. */
		if (strcmp(key, "GNU.sparse.numblocks") == 0) {
			tar->sparse_offset = -1;
			tar->sparse_numbytes = -1;
			tar->sparse_gnu_major = 0;
			tar->sparse_gnu_minor = 0;
		}
		if (strcmp(key, "GNU.sparse.offset") == 0) {
			tar->sparse_offset = tar_atol10(value, strlen(value));
			if (tar->sparse_numbytes != -1) {
				if (gnu_add_sparse_entry(a, tar,
				    tar->sparse_offset, tar->sparse_numbytes)
				    != ARCHIVE_OK)
					return (ARCHIVE_FATAL);
				tar->sparse_offset = -1;
				tar->sparse_numbytes = -1;
			}
		}
		if (strcmp(key, "GNU.sparse.numbytes") == 0) {
			tar->sparse_numbytes = tar_atol10(value, strlen(value));
			if (tar->sparse_offset != -1) {
				if (gnu_add_sparse_entry(a, tar,
				    tar->sparse_offset, tar->sparse_numbytes)
				    != ARCHIVE_OK)
					return (ARCHIVE_FATAL);
				tar->sparse_offset = -1;
				tar->sparse_numbytes = -1;
			}
		}
		if (strcmp(key, "GNU.sparse.size") == 0) {
			tar->realsize = tar_atol10(value, strlen(value));
			archive_entry_set_size(entry, tar->realsize);
			tar->realsize_override = 1;
		}

		/* GNU "0.1" sparse pax format. */
		if (strcmp(key, "GNU.sparse.map") == 0) {
			tar->sparse_gnu_major = 0;
			tar->sparse_gnu_minor = 1;
			if (gnu_sparse_01_parse(a, tar, value) != ARCHIVE_OK)
				return (ARCHIVE_WARN);
		}

		/* GNU "1.0" sparse pax format */
		if (strcmp(key, "GNU.sparse.major") == 0) {
			tar->sparse_gnu_major = (int)tar_atol10(value, strlen(value));
			tar->sparse_gnu_pending = 1;
		}
		if (strcmp(key, "GNU.sparse.minor") == 0) {
			tar->sparse_gnu_minor = (int)tar_atol10(value, strlen(value));
			tar->sparse_gnu_pending = 1;
		}
		if (strcmp(key, "GNU.sparse.name") == 0) {
			/*
			 * The real filename; when storing sparse
			 * files, GNU tar puts a synthesized name into
			 * the regular 'path' attribute in an attempt
			 * to limit confusion. ;-)
			 */
			archive_strcpy(&(tar->entry_pathname_override), value);
		}
		if (strcmp(key, "GNU.sparse.realsize") == 0) {
			tar->realsize = tar_atol10(value, strlen(value));
			archive_entry_set_size(entry, tar->realsize);
			tar->realsize_override = 1;
		}
		break;
	case 'L':
		/* Our extensions */
/* TODO: Handle arbitrary extended attributes... */
/*
		if (strcmp(key, "LIBARCHIVE.xxxxxxx") == 0)
			archive_entry_set_xxxxxx(entry, value);
*/
		if (strcmp(key, "LIBARCHIVE.creationtime") == 0) {
			pax_time(value, &s, &n);
			archive_entry_set_birthtime(entry, s, n);
		}
		if (strcmp(key, "LIBARCHIVE.symlinktype") == 0) {
			if (strcmp(value, "file") == 0) {
				archive_entry_set_symlink_type(entry,
				    AE_SYMLINK_TYPE_FILE);
			} else if (strcmp(value, "dir") == 0) {
				archive_entry_set_symlink_type(entry,
				    AE_SYMLINK_TYPE_DIRECTORY);
			}
		}
		if (memcmp(key, "LIBARCHIVE.xattr.", 17) == 0)
			pax_attribute_xattr(entry, key, value);
		break;
	case 'R':
		/* GNU tar uses RHT.security header to store SELinux xattrs
		 * SCHILY.xattr.security.selinux == RHT.security.selinux */
		if (strcmp(key, "RHT.security.selinux") == 0) {
			pax_attribute_rht_security_selinux(entry, value,
			    value_length);
			}
		break;
	case 'S':
		/* We support some keys used by the "star" archiver */
		if (strcmp(key, "SCHILY.acl.access") == 0) {
			r = pax_attribute_acl(a, tar, entry, value,
			    ARCHIVE_ENTRY_ACL_TYPE_ACCESS);
			if (r == ARCHIVE_FATAL)
				return (r);
		} else if (strcmp(key, "SCHILY.acl.default") == 0) {
			r = pax_attribute_acl(a, tar, entry, value,
			    ARCHIVE_ENTRY_ACL_TYPE_DEFAULT);
			if (r == ARCHIVE_FATAL)
				return (r);
		} else if (strcmp(key, "SCHILY.acl.ace") == 0) {
			r = pax_attribute_acl(a, tar, entry, value,
			    ARCHIVE_ENTRY_ACL_TYPE_NFS4);
			if (r == ARCHIVE_FATAL)
				return (r);
		} else if (strcmp(key, "SCHILY.devmajor") == 0) {
			archive_entry_set_rdevmajor(entry,
			    (dev_t)tar_atol10(value, strlen(value)));
		} else if (strcmp(key, "SCHILY.devminor") == 0) {
			archive_entry_set_rdevminor(entry,
			    (dev_t)tar_atol10(value, strlen(value)));
		} else if (strcmp(key, "SCHILY.fflags") == 0) {
			archive_entry_copy_fflags_text(entry, value);
		} else if (strcmp(key, "SCHILY.dev") == 0) {
			archive_entry_set_dev(entry,
			    (dev_t)tar_atol10(value, strlen(value)));
		} else if (strcmp(key, "SCHILY.ino") == 0) {
			archive_entry_set_ino(entry,
			    tar_atol10(value, strlen(value)));
		} else if (strcmp(key, "SCHILY.nlink") == 0) {
			archive_entry_set_nlink(entry, (unsigned)
			    tar_atol10(value, strlen(value)));
		} else if (strcmp(key, "SCHILY.realsize") == 0) {
			tar->realsize = tar_atol10(value, strlen(value));
			tar->realsize_override = 1;
			archive_entry_set_size(entry, tar->realsize);
		} else if (strncmp(key, "SCHILY.xattr.", 13) == 0) {
			pax_attribute_schily_xattr(entry, key, value,
			    value_length);
		} else if (strcmp(key, "SUN.holesdata") == 0) {
			/* A Solaris extension for sparse. */
			r = solaris_sparse_parse(a, tar, entry, value);
			if (r < err) {
				if (r == ARCHIVE_FATAL)
					return (r);
				err = r;
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Parse error: SUN.holesdata");
			}
		}
		break;
	case 'a':
		if (strcmp(key, "atime") == 0) {
			pax_time(value, &s, &n);
			archive_entry_set_atime(entry, s, n);
		}
		break;
	case 'c':
		if (strcmp(key, "ctime") == 0) {
			pax_time(value, &s, &n);
			archive_entry_set_ctime(entry, s, n);
		} else if (strcmp(key, "charset") == 0) {
			/* TODO: Publish charset information in entry. */
		} else if (strcmp(key, "comment") == 0) {
			/* TODO: Publish comment in entry. */
		}
		break;
	case 'g':
		if (strcmp(key, "gid") == 0) {
			archive_entry_set_gid(entry,
			    tar_atol10(value, strlen(value)));
		} else if (strcmp(key, "gname") == 0) {
			archive_strcpy(&(tar->entry_gname), value);
		}
		break;
	case 'h':
		if (strcmp(key, "hdrcharset") == 0) {
			if (strcmp(value, "BINARY") == 0)
				/* Binary  mode. */
				tar->pax_hdrcharset_binary = 1;
			else if (strcmp(value, "ISO-IR 10646 2000 UTF-8") == 0)
				tar->pax_hdrcharset_binary = 0;
		}
		break;
	case 'l':
		/* pax interchange doesn't distinguish hardlink vs. symlink. */
		if (strcmp(key, "linkpath") == 0) {
			archive_strcpy(&(tar->entry_linkpath), value);
		}
		break;
	case 'm':
		if (strcmp(key, "mtime") == 0) {
			pax_time(value, &s, &n);
			archive_entry_set_mtime(entry, s, n);
		}
		break;
	case 'p':
		if (strcmp(key, "path") == 0) {
			archive_strcpy(&(tar->entry_pathname), value);
		}
		break;
	case 'r':
		/* POSIX has reserved 'realtime.*' */
		break;
	case 's':
		/* POSIX has reserved 'security.*' */
		/* Someday: if (strcmp(key, "security.acl") == 0) { ... } */
		if (strcmp(key, "size") == 0) {
			/* "size" is the size of the data in the entry. */
			tar->entry_bytes_remaining
			    = tar_atol10(value, strlen(value));
			/*
			 * The "size" pax header keyword always overrides the
			 * "size" field in the tar header.
			 * GNU.sparse.realsize, GNU.sparse.size and
			 * SCHILY.realsize override this value.
			 */
			if (!tar->realsize_override) {
				archive_entry_set_size(entry,
				    tar->entry_bytes_remaining);
				tar->realsize
				    = tar->entry_bytes_remaining;
			}
		}
		break;
	case 'u':
		if (strcmp(key, "uid") == 0) {
			archive_entry_set_uid(entry,
			    tar_atol10(value, strlen(value)));
		} else if (strcmp(key, "uname") == 0) {
			archive_strcpy(&(tar->entry_uname), value);
		}
		break;
	}
	return (err);
}